

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O2

int32_t icu_63::MeasureUnit::getAvailable
                  (MeasureUnit *dest,int32_t destCapacity,UErrorCode *errorCode)

{
  long lVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  if (destCapacity < 0x1b9) {
    *errorCode = U_BUFFER_OVERFLOW_ERROR;
  }
  else {
    lVar1 = 0;
    lVar2 = 0;
    while (lVar2 != 0x14) {
      iVar3 = (&DAT_00305d14)[lVar2] - (&gOffsets)[lVar2];
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      pcVar4 = dest[(int)lVar1].fCurrency;
      for (lVar5 = 0; iVar3 != (int)lVar5; lVar5 = lVar5 + 1) {
        *(int32_t *)(pcVar4 + -8) = (int32_t)lVar2;
        *(int *)(pcVar4 + -4) = (int)lVar5;
        *pcVar4 = '\0';
        pcVar4 = pcVar4 + 0x18;
      }
      lVar1 = (int)lVar1 + lVar5;
      lVar2 = lVar2 + 1;
    }
  }
  return 0x1b9;
}

Assistant:

int32_t MeasureUnit::getAvailable(
        MeasureUnit *dest,
        int32_t destCapacity,
        UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) {
        return 0;
    }
    if (destCapacity < UPRV_LENGTHOF(gSubTypes)) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return UPRV_LENGTHOF(gSubTypes);
    }
    int32_t idx = 0;
    for (int32_t typeIdx = 0; typeIdx < UPRV_LENGTHOF(gTypes); ++typeIdx) {
        int32_t len = gOffsets[typeIdx + 1] - gOffsets[typeIdx];
        for (int32_t subTypeIdx = 0; subTypeIdx < len; ++subTypeIdx) {
            dest[idx].setTo(typeIdx, subTypeIdx);
            ++idx;
        }
    }
    U_ASSERT(idx == UPRV_LENGTHOF(gSubTypes));
    return UPRV_LENGTHOF(gSubTypes);
}